

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOPofR.cpp
# Opt level: O2

void __thiscall
OpenMD::IcosahedralOfR::IcosahedralOfR
          (IcosahedralOfR *this,SimInfo *info,string *filename,string *sele,double rCut,uint nbins,
          RealType len)

{
  allocator<char> local_31;
  string local_30 [32];
  
  BOPofR::BOPofR(&this->super_BOPofR,info,filename,sele,rCut,nbins,len);
  (this->super_BOPofR).super_StaticAnalyser._vptr_StaticAnalyser =
       (_func_int **)&PTR__BOPofR_002ecdc8;
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"Icosahedral Bond Order Parameter(r)",&local_31);
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_BOPofR).super_StaticAnalyser.analysisType_);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

IcosahedralOfR::IcosahedralOfR(SimInfo* info, const std::string& filename,
                                 const std::string& sele, double rCut,
                                 unsigned int nbins, RealType len) :
      BOPofR(info, filename, sele, rCut, nbins, len) {
    setAnalysisType("Icosahedral Bond Order Parameter(r)");
  }